

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

quatf tinyusdz::slerp(quatf *a,quatf *b,float t)

{
  vec<float,_4> vVar1;
  quatf qVar2;
  undefined1 auStack_68 [8];
  vec<float,_4> qret;
  vec<float,_4> qb;
  vec<float,_4> qa;
  float t_local;
  quatf *b_local;
  quatf *a_local;
  quatf ret;
  
  linalg::vec<float,_4>::vec((vec<float,_4> *)&qb.z);
  linalg::vec<float,_4>::vec((vec<float,_4> *)&qret.z);
  linalg::vec<float,_4>::vec((vec<float,_4> *)auStack_68);
  qb.z = (a->imag)._M_elems[0];
  qb.w = (a->imag)._M_elems[1];
  qret.z = (b->imag)._M_elems[0];
  qret.w = (b->imag)._M_elems[1];
  qb._0_8_ = *(undefined8 *)((b->imag)._M_elems + 2);
  vVar1 = linalg::slerp<float,4>((vec<float,_4> *)&qb.z,(vec<float,_4> *)&qret.z,t);
  qVar2.imag._M_elems[0] = vVar1.x;
  qVar2.imag._M_elems[1] = vVar1.y;
  qVar2.imag._M_elems[2] = vVar1.z;
  qVar2.real = vVar1.w;
  return qVar2;
}

Assistant:

value::quatf slerp(const value::quatf &a, const value::quatf &b, const float t) {
  linalg::vec<float, 4> qa;    
  linalg::vec<float, 4> qb;    
  linalg::vec<float, 4> qret;    

  memcpy(reinterpret_cast<value::quatf *>(&qa), &a, sizeof(float) * 4);
  memcpy(reinterpret_cast<value::quatf *>(&qb), &b, sizeof(float) * 4);

  qret = linalg::slerp(qa, qb, t);
  
  value::quatf ret;
  memcpy(&ret, reinterpret_cast<value::quatf *>(&qret), sizeof(float) * 4);
  return ret;
}